

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::SetData
          (TPZQuadSphere<pzgeom::TPZGeoQuad> *this,REAL *R,TPZVec<double> *xc)

{
  undefined8 *in_RSI;
  TPZVec<double> *in_RDI;
  
  in_RDI[1].fStore = (double *)*in_RSI;
  TPZVec<double>::operator=(xc,in_RDI);
  return;
}

Assistant:

void SetData(const REAL &R, const TPZVec<REAL> &xc)
		{
			fR = R;
			fxc = xc;
#ifdef PZDEBUG
			if (R <= 0) {
				PZError << "R must be positive!\n";
				DebugStop();
			}
			if (xc.NElements() != 3) {
				PZError << "XCenter must have 3 coordinates!\n";
				DebugStop();
			}
#endif
		}